

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O3

void P_SerializePlayers(FSerializer *arc,bool skipload)

{
  char *__s2;
  undefined1 auVar1 [13];
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  uint5 uVar5;
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  uint uVar8;
  undefined8 *puVar9;
  bool bVar10;
  undefined4 uVar11;
  char **ppcVar12;
  ulong *puVar13;
  undefined8 *puVar14;
  FPlayerStart *mthing;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  char **charptr;
  player_t *ppVar18;
  int i;
  player_t *ppVar19;
  long *plVar20;
  ulong uVar21;
  undefined1 *puVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  int iVar26;
  int numPlayers;
  char *name;
  char *n;
  void *local_328;
  uint local_2fc;
  undefined4 local_2f8;
  int local_2f4;
  char *local_2f0;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  player_t local_2d0;
  
  auVar1[0xc] = SUB41(playeringame._0_4_,3);
  auVar1._0_12_ = ZEXT712(0);
  uVar5 = CONCAT32(auVar1._10_3_,(ushort)SUB41(playeringame._0_4_,2));
  auVar7._5_8_ = 0;
  auVar7._0_5_ = uVar5;
  uVar21 = (ulong)(ushort)playeringame._4_4_ & 0xffffffffffff00ff;
  auVar2._8_4_ = 0;
  auVar2._0_8_ = uVar21;
  auVar2[0xc] = SUB41(playeringame._4_4_,3);
  auVar3[8] = SUB41(playeringame._4_4_,2);
  auVar3._0_8_ = uVar21;
  auVar3[9] = 0;
  auVar3._10_3_ = auVar2._10_3_;
  auVar6._5_8_ = 0;
  auVar6._0_5_ = auVar3._8_5_;
  auVar4[4] = SUB41(playeringame._4_4_,1);
  auVar4._0_4_ = (int)uVar21;
  auVar4[5] = 0;
  auVar4._6_7_ = SUB137(auVar6 << 0x40,6);
  iVar25 = auVar3._8_4_ + (int)uVar5;
  iVar26 = (uint)(uint3)(auVar2._10_3_ >> 0x10) + (uint)(uint3)(auVar1._10_3_ >> 0x10);
  iStack_2dc = iVar26 + auVar4._4_4_ +
                        (int)CONCAT72(SUB137(auVar7 << 0x40,6),(ushort)SUB41(playeringame._0_4_,1));
  local_2f4 = iStack_2dc + iVar25 + (int)uVar21 + (playeringame._0_4_ & 0xff);
  iStack_2e4 = iStack_2dc * 2;
  iStack_2e0 = iStack_2dc + iVar25 * 2;
  iStack_2dc = iStack_2dc + iVar26 * 2;
  if (arc->w == (FWriter *)0x0) {
    local_2e8 = local_2f4;
    Serialize(arc,"numplayers",(int32_t *)&local_2fc,(int32_t *)0x0);
    bVar10 = FSerializer::BeginArray(arc,"players");
    uVar8 = local_2fc;
    if (bVar10) {
      uVar21 = (ulong)(int)local_2fc;
      if (uVar21 == 1) {
        local_2f0 = (char *)0x0;
        bVar10 = FSerializer::BeginObject(arc,(char *)0x0);
        if (bVar10) {
          FSerializer::StringPtr(arc,"playername",&local_2f0);
          ppVar19 = (player_t *)&players;
          lVar16 = 0;
          bVar10 = false;
          do {
            if (playeringame[lVar16] == true) {
              if (bVar10) {
                bVar10 = true;
                if (ppVar19->mo != (APlayerPawn *)0x0) {
                  (*(ppVar19->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
                  ppVar19->mo = (APlayerPawn *)0x0;
                }
              }
              else {
                player_t::player_t(&local_2d0);
                player_t::Serialize(&local_2d0,arc);
                if (skipload) {
                  ppVar19->mo = local_2d0.mo;
                }
                else {
                  local_2d0.MinPitch.Degrees = ((local_2d0.mo)->super_AActor).Angles.Pitch.Degrees;
                  local_2d0.MaxPitch.Degrees = local_2d0.MinPitch.Degrees;
                  CopyPlayer(ppVar19,&local_2d0,local_2f0);
                }
                player_t::~player_t(&local_2d0);
                bVar10 = true;
              }
            }
            lVar16 = lVar16 + 1;
            ppVar19 = ppVar19 + 1;
          } while (lVar16 != 8);
          FSerializer::EndObject(arc);
        }
      }
      else {
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar21;
        uVar17 = SUB168(auVar24 * ZEXT816(0x2a0),0) | 8;
        if (SUB168(auVar24 * ZEXT816(0x2a0),8) != 0) {
          uVar17 = 0xffffffffffffffff;
        }
        uVar15 = uVar21 * 8;
        if ((int)local_2fc < 0) {
          uVar15 = 0xffffffffffffffff;
        }
        ppcVar12 = (char **)operator_new__(uVar15);
        puVar13 = (ulong *)operator_new__(uVar17);
        *puVar13 = uVar21;
        ppVar19 = (player_t *)(puVar13 + 1);
        if (uVar8 == 0) {
          local_328 = operator_new__(uVar21);
          uVar11 = 0;
        }
        else {
          lVar16 = 0;
          ppVar18 = ppVar19;
          do {
            player_t::player_t(ppVar18);
            lVar16 = lVar16 + -0x2a0;
            ppVar18 = ppVar18 + 1;
          } while (uVar21 * -0x2a0 - lVar16 != 0);
          local_328 = operator_new__(uVar21);
          if ((int)uVar8 < 1) {
            uVar11 = 0;
          }
          else {
            uVar17 = 0;
            ppVar18 = ppVar19;
            charptr = ppcVar12;
            do {
              *charptr = (char *)0x0;
              bVar10 = FSerializer::BeginObject(arc,(char *)0x0);
              if (bVar10) {
                FSerializer::StringPtr(arc,"playername",charptr);
                player_t::Serialize(ppVar18,arc);
                FSerializer::EndObject(arc);
              }
              *(undefined1 *)((long)local_328 + uVar17) = 0;
              uVar17 = uVar17 + 1;
              ppVar18 = ppVar18 + 1;
              charptr = charptr + 1;
            } while (uVar21 != uVar17);
            uVar11 = (undefined4)CONCAT71((int7)((ulong)local_328 >> 8),1);
          }
        }
        auVar23[4] = playeringame[4];
        auVar23[5] = playeringame[5];
        auVar23[6] = playeringame[6];
        auVar23[7] = playeringame[7];
        auVar23[0] = playeringame[0];
        auVar23[1] = playeringame[1];
        auVar23[2] = playeringame[2];
        auVar23[3] = playeringame[3];
        auVar23._8_8_ = 0;
        auVar24 = psllw(auVar23,7);
        auVar24 = auVar24 & _DAT_00605d50;
        local_2d0.mo = (APlayerPawn *)
                       (~CONCAT17(-(auVar24[7] < '\0'),
                                  CONCAT16(-(auVar24[6] < '\0'),
                                           CONCAT15(-(auVar24[5] < '\0'),
                                                    CONCAT14(-(auVar24[4] < '\0'),
                                                             CONCAT13(-(auVar24[3] < '\0'),
                                                                      CONCAT12(-(auVar24[2] < '\0'),
                                                                               CONCAT11(-(auVar24[1]
                                                                                         < '\0'),-(
                                                  auVar24[0] < '\0')))))))) & (ulong)DAT_00605d60);
        if (skipload) {
          lVar16 = 0;
          do {
            *(undefined8 *)((long)&players + lVar16) = *(undefined8 *)((long)&ppVar19->mo + lVar16);
            lVar16 = lVar16 + 0x2a0;
          } while (lVar16 != 0x1500);
        }
        else {
          local_2f8 = uVar11;
          if ((char)uVar11 != '\0') {
            uVar17 = 0;
            do {
              uVar15 = 0;
              do {
                if (*(char *)((long)&local_2d0.mo + uVar15) == '\0') {
                  puVar9 = (undefined8 *)
                           ((ulong)(((&DAT_017e1e88)[uVar15 * 0xa8] - 1 & 0x1ea) * 0x18) +
                           (&DAT_017e1e78)[uVar15 * 0x54]);
                  do {
                    puVar14 = puVar9;
                    puVar9 = (undefined8 *)*puVar14;
                  } while (*(int *)(puVar14 + 1) != 0x1ea);
                  __s2 = ppcVar12[uVar17];
                  iVar25 = strcasecmp(*(char **)(puVar14[2] + 0x28),__s2);
                  if (iVar25 == 0) {
                    Printf("Found player %d (%s) at %d\n",uVar17 & 0xffffffff,__s2,
                           uVar15 & 0xffffffff);
                    CopyPlayer((player_t *)(&players + uVar15 * 0x54),ppVar19 + uVar17,
                               ppcVar12[uVar17]);
                    *(undefined1 *)((long)&local_2d0.mo + uVar15) = 1;
                    *(undefined1 *)((long)local_328 + uVar17) = 1;
                    break;
                  }
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 != 8);
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar21);
            uVar17 = 0;
            do {
              if (*(char *)((long)local_328 + uVar17) == '\0') {
                ppVar18 = (player_t *)&players;
                uVar15 = 0;
LAB_0043f693:
                if (*(char *)((long)&local_2d0.mo + uVar15) != '\0') goto code_r0x0043f69a;
                puVar9 = (undefined8 *)
                         ((long)&((ppVar18->userinfo).
                                  super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                                 .Nodes)->Next +
                         (ulong)(((ppVar18->userinfo).
                                  super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                                  .Size - 1 & 0x1ea) * 0x18));
                do {
                  puVar14 = puVar9;
                  puVar9 = (undefined8 *)*puVar14;
                } while (*(int *)(puVar14 + 1) != 0x1ea);
                Printf("Assigned player %d (%s) to %d (%s)\n",uVar17 & 0xffffffff,ppcVar12[uVar17],
                       uVar15 & 0xffffffff,*(undefined8 *)(puVar14[2] + 0x28));
                CopyPlayer(ppVar18,ppVar19 + uVar17,ppcVar12[uVar17]);
                *(undefined1 *)((long)&local_2d0.mo + uVar15) = 1;
                *(undefined1 *)((long)local_328 + uVar17) = 1;
              }
LAB_0043f720:
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar21);
          }
          plVar20 = &players;
          lVar16 = 0;
          do {
            if ((*(char *)((long)&local_2d0.mo + lVar16) == '\0') &&
               ((long *)*plVar20 != (long *)0x0)) {
              (**(code **)(*(long *)*plVar20 + 0x20))();
              *plVar20 = 0;
            }
            lVar16 = lVar16 + 1;
            plVar20 = plVar20 + 0x54;
          } while (lVar16 != 8);
          if ((char)local_2f8 != '\0') {
            uVar21 = 0;
            do {
              if (*(char *)((long)local_328 + uVar21) == '\0') {
                (*(ppVar19->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
                ppVar19->mo = (APlayerPawn *)0x0;
              }
              uVar21 = uVar21 + 1;
              ppVar19 = ppVar19 + 1;
            } while (uVar8 != uVar21);
          }
        }
        operator_delete__(local_328);
        lVar16 = *puVar13 * 0x2a0;
        uVar21 = lVar16 + 8;
        uVar17 = *puVar13;
        while (uVar17 != 0) {
          player_t::~player_t((player_t *)((long)puVar13 + lVar16 + -0x298));
          lVar16 = lVar16 + -0x2a0;
          uVar17 = lVar16;
        }
        operator_delete__(puVar13,uVar21);
        operator_delete__(ppcVar12);
      }
      FSerializer::EndArray(arc);
    }
    if (((!skipload) && ((int)local_2fc < local_2e8)) && (deathmatch.Value == 0)) {
      puVar22 = &DAT_017e1e48;
      mthing = playerstarts;
      lVar16 = 0;
      do {
        if ((playeringame[lVar16] == true) && (*(long *)(puVar22 + -8) == 0)) {
          *puVar22 = 3;
          P_SpawnPlayer(mthing,(int)lVar16,level.flags2 >> 6 & 2);
        }
        lVar16 = lVar16 + 1;
        mthing = mthing + 1;
        puVar22 = puVar22 + 0x2a0;
      } while (lVar16 != 8);
    }
    player_t::SendPitchLimits((player_t *)(&players + (long)consoleplayer * 0x54));
  }
  else {
    Serialize(arc,"numplayers",&local_2f4,(int32_t *)0x0);
    bVar10 = FSerializer::BeginArray(arc,"players");
    if (bVar10) {
      lVar16 = 0;
      do {
        if ((playeringame[lVar16] == true) &&
           (bVar10 = FSerializer::BeginObject(arc,(char *)0x0), bVar10)) {
          puVar9 = (undefined8 *)
                   ((ulong)(((&DAT_017e1e88)[lVar16 * 0xa8] - 1 & 0x1ea) * 0x18) +
                   (&DAT_017e1e78)[lVar16 * 0x54]);
          do {
            puVar14 = puVar9;
            puVar9 = (undefined8 *)*puVar14;
          } while (*(int *)(puVar14 + 1) != 0x1ea);
          local_2d0.mo = *(APlayerPawn **)(puVar14[2] + 0x28);
          FSerializer::StringPtr(arc,"playername",(char **)&local_2d0);
          player_t::Serialize((player_t *)(&players + lVar16 * 0x54),arc);
          FSerializer::EndObject(arc);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 8);
      FSerializer::EndArray(arc);
    }
  }
  return;
code_r0x0043f69a:
  uVar15 = uVar15 + 1;
  ppVar18 = ppVar18 + 1;
  if (uVar15 == 8) goto LAB_0043f720;
  goto LAB_0043f693;
}

Assistant:

void P_SerializePlayers(FSerializer &arc, bool skipload)
{
	int numPlayers, numPlayersNow;
	int i;

	// Count the number of players present right now.
	for (numPlayersNow = 0, i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			++numPlayersNow;
		}
	}

	if (arc.isWriting())
	{
		// Record the number of players in this save.
		arc("numplayers", numPlayersNow);
		if (arc.BeginArray("players"))
		{
			// Record each player's name, followed by their data.
			for (i = 0; i < MAXPLAYERS; ++i)
			{
				if (playeringame[i])
				{
					if (arc.BeginObject(nullptr))
					{
						const char *n = players[i].userinfo.GetName();
						arc.StringPtr("playername", n);
						players[i].Serialize(arc);
						arc.EndObject();
					}
				}
			}
			arc.EndArray();
		}
	}
	else
	{
		arc("numplayers", numPlayers);

		if (arc.BeginArray("players"))
		{
			// If there is only one player in the game, they go to the
			// first player present, no matter what their name.
			if (numPlayers == 1)
			{
				ReadOnePlayer(arc, skipload);
			}
			else
			{
				ReadMultiplePlayers(arc, numPlayers, numPlayersNow, skipload);
			}
			arc.EndArray();
		}
		if (!skipload && numPlayersNow > numPlayers)
		{
			SpawnExtraPlayers();
		}
		// Redo pitch limits, since the spawned player has them at 0.
		players[consoleplayer].SendPitchLimits();
	}
}